

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O3

int_t mc64ud_(int_t *id,int_t *mod,int_t *n,int_t *irn,int_t *lirn,int_t *ip,int_t *lenc,int_t *fc,
             int_t *iperm,int_t *num,int_t *numx,int_t *pr,int_t *arp,int_t *cv,int_t *out)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int_t *piVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int local_a0;
  uint local_9c;
  uint local_98;
  
  if (*id == 1) {
    uVar12 = *n;
    if ((int)uVar12 < 1) {
      piVar16 = (int_t *)0x1;
      local_9c = uVar12;
      local_98 = uVar12;
    }
    else {
      piVar16 = (int_t *)(ulong)(uVar12 + 1);
      uVar10 = 0;
      do {
        cv[uVar10] = 0;
        arp[uVar10] = 0;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      uVar12 = *n;
      local_9c = uVar12;
      local_98 = uVar12;
    }
  }
  else {
    uVar12 = *n;
    piVar16 = id;
    if (*mod == 1) {
      if ((int)uVar12 < 1) {
        piVar16 = (int_t *)0x1;
      }
      else {
        memset(arp,0,(ulong)uVar12 * 4);
        uVar14 = uVar12 + 1;
        uVar12 = *n;
        piVar16 = (int_t *)(ulong)uVar14;
      }
    }
    local_9c = uVar12 - *numx;
    local_98 = *numx;
  }
  iVar18 = *num;
  uVar10 = (ulong)iVar18;
  if (iVar18 < (int)uVar12) {
    iVar2 = *id;
    local_a0 = iVar18 + 2;
    iVar6 = 0;
    uVar15 = (long)(int)uVar12;
    uVar17 = uVar10;
    do {
      iVar18 = iVar18 + 1;
      uVar1 = uVar17 + 1;
      uVar14 = fc[uVar17 - uVar10];
      uVar7 = (ulong)uVar14;
      lVar11 = (long)(int)uVar14;
      pr[lVar11 + -1] = -1;
      if (-1 < (long)uVar17) {
        iVar22 = (int)uVar1 + (iVar2 + -1) * uVar12;
        iVar9 = 1;
        do {
          uVar14 = (uint)uVar7;
          lVar11 = (long)(int)uVar14;
          iVar8 = lenc[lVar11 + -1];
          if (arp[lVar11 + -1] < iVar8) {
            uVar15 = (ulong)(arp[lVar11 + -1] + ip[lVar11 + -1]);
            do {
              piVar16 = (int_t *)(long)irn[uVar15 - 1];
              if (iperm[(long)piVar16 + -1] == 0) goto LAB_00115bd6;
              uVar15 = uVar15 + 1;
            } while ((long)uVar15 < (long)(ip[lVar11 + -1] + iVar8));
            arp[lVar11 + -1] = iVar8;
            iVar8 = lenc[lVar11 + -1];
          }
          out[lVar11 + -1] = iVar8 + -1;
          iVar8 = 1;
          uVar20 = uVar7 & 0xffffffff;
          do {
            iVar19 = (int)uVar20;
            uVar14 = out[(long)iVar19 + -1];
            if (-1 < (long)(int)uVar14) {
              iVar3 = ip[(long)iVar19 + -1];
              iVar4 = lenc[(long)iVar19 + -1];
              iVar21 = iVar4 + iVar3 + -1;
              uVar13 = iVar21 - uVar14;
              uVar15 = (ulong)uVar13;
              if ((int)uVar13 < iVar4 + iVar3) {
                lVar11 = 0;
                do {
                  uVar13 = irn[((long)iVar21 + lVar11 + -1) - (long)(int)uVar14];
                  piVar16 = (int_t *)(ulong)uVar13;
                  if (cv[(long)(int)uVar13 + -1] != iVar22) {
                    uVar15 = (ulong)(~uVar14 + iVar4 + iVar3 + (uint)lVar11);
                    uVar7 = (ulong)iperm[(long)(int)uVar13 + -1];
                    cv[(long)(int)uVar13 + -1] = iVar22;
                    pr[uVar7 - 1] = iVar19;
                    out[(long)iVar19 + -1] = ~(uint)lVar11 + uVar14;
                    goto LAB_00115b95;
                  }
                  lVar11 = lVar11 + 1;
                  uVar15 = (ulong)(uint)(iVar4 + iVar3);
                } while (uVar14 + 1 != (int)lVar11);
              }
            }
            uVar14 = pr[(long)iVar19 + -1];
            uVar7 = (ulong)uVar14;
            if (uVar14 == 0xffffffff) {
              iVar9 = iVar6 + 1;
              fc[iVar6] = iVar19;
              bVar5 = (int)local_9c <= iVar6;
              iVar6 = iVar9;
              if (bVar5) goto LAB_00115cb2;
              goto LAB_00115c48;
            }
            iVar8 = iVar8 + 1;
            uVar20 = (ulong)uVar14;
          } while (iVar8 != local_a0);
LAB_00115b95:
          uVar14 = (uint)uVar7;
          iVar9 = iVar9 + 1;
        } while (iVar9 != local_a0);
        lVar11 = (long)(int)uVar14;
      }
LAB_00115bd6:
      iperm[(long)(int)piVar16 + -1] = uVar14;
      arp[lVar11 + -1] = ((int)uVar15 - ip[lVar11 + -1]) + 1;
      uVar13 = *num + 1;
      *num = uVar13;
      if (-1 < (long)uVar17) {
        iVar9 = pr[(long)(int)uVar14 + -1];
        if (iVar9 != -1) {
          iVar22 = 0;
          do {
            uVar14 = ((ip[(long)iVar9 + -1] + lenc[(long)iVar9 + -1]) - out[(long)iVar9 + -1]) - 2;
            uVar15 = (ulong)uVar14;
            piVar16 = (int_t *)(long)irn[(long)(int)uVar14 + -1];
            iperm[(long)piVar16 + -1] = iVar9;
            iVar22 = iVar22 + 1;
            if (iVar18 == iVar22) break;
            iVar9 = pr[(long)iVar9 + -1];
          } while (iVar9 != -1);
        }
        uVar13 = *num;
      }
      iVar9 = iVar6;
      if (uVar13 == local_98) {
LAB_00115cb2:
        iVar2 = *n;
        if (iVar2 <= (int)uVar1) {
          return 0;
        }
        lVar11 = 0;
        do {
          fc[iVar9 + lVar11] = fc[(iVar18 + lVar11) - uVar10];
          lVar11 = lVar11 + 1;
        } while ((long)iVar2 - (long)iVar18 != lVar11);
        return 0;
      }
LAB_00115c48:
      local_a0 = local_a0 + 1;
      uVar17 = uVar1;
    } while (uVar1 != (long)(int)uVar12);
  }
  return 0;
}

Assistant:

int_t mc64ud_(int_t *id, int_t *mod, int_t *n, int_t *
	irn, int_t *lirn, int_t *ip, int_t *lenc, int_t *fc, int_t *
	iperm, int_t *num, int_t *numx, int_t *pr, int_t *arp, 
	int_t *cv, int_t *out)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, j1, ii, kk, id0, id1, in1, in2, nfc, num0, num1, num2, 
	    jord, last;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* PR(J) is the previous column to J in the depth first search. */
/*   Array PR is used as workspace in the sorting algorithm. */
/* Elements (I,IPERM(I)) I=1,..,N are entries at the end of the */
/*   algorithm unless N assignments have not been made in which case */
/*   N-NUM pairs (I,IPERM(I)) will not be entries in the matrix. */
/* CV(I) is the most recent loop number (ID+JORD) at which row I */
/*   was visited. */
/* ARP(J) is the number of entries in column J which have been scanned */
/*   when looking for a cheap assignment. */
/* OUT(J) is one less than the number of entries in column J which have */
/*   not been scanned during one pass through the main loop. */
/* NUMX is maximum possible size of matching. */
    /* Parameter adjustments */
    --out;
    --cv;
    --arp;
    --pr;
    --iperm;
    --fc;
    --lenc;
    --ip;
    --irn;

    /* Function Body */
    if (*id == 1) {
/* The first call to MC64U/UD. */
/* Initialize CV and ARP; parameters MOD, NUMX are not accessed */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    cv[i__] = 0;
	    arp[i__] = 0;
/* L5: */
	}
	num1 = *n;
	num2 = *n;
    } else {
/* Not the first call to MC64U/UD. */
/* Re-initialize ARP if entries were deleted since last call to MC64U/UD */
	if (*mod == 1) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		arp[i__] = 0;
/* L8: */
	    }
	}
	num1 = *numx;
	num2 = *n - *numx;
    }
    num0 = *num;
/* NUM0 is size of input matching */
/* NUM1 is maximum possible size of matching */
/* NUM2 is maximum allowed number of unassigned rows/columns */
/* NUM is size of current matching */
/* Quick return if possible */
/*      IF (NUM.EQ.N) GO TO 199 */
/* NFC is number of rows/columns that could not be assigned */
    nfc = 0;
/* Integers ID0+1 to ID0+N are unique numbers for call ID to MC64U/UD, */
/* so 1st call uses 1..N, 2nd call uses N+1..2N, etc */
    id0 = (*id - 1) * *n;
/* Main loop. Each pass round this loop either results in a new */
/* assignment or gives a column with no assignment */
    i__1 = *n;
    for (jord = num0 + 1; jord <= i__1; ++jord) {
/* Each pass uses unique number ID1 */
	id1 = id0 + jord;
/* J is unmatched column */
	j = fc[jord - num0];
	pr[j] = -1;
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
/* Look for a cheap assignment */
	    if (arp[j] >= lenc[j]) {
		goto L30;
	    }
	    in1 = ip[j] + arp[j];
	    in2 = ip[j] + lenc[j] - 1;
	    i__3 = in2;
	    for (ii = in1; ii <= i__3; ++ii) {
		i__ = irn[ii];
		if (iperm[i__] == 0) {
		    goto L80;
		}
/* L20: */
	    }
/* No cheap assignment in row */
	    arp[j] = lenc[j];
/* Begin looking for assignment chain starting with row J */
L30:
	    out[j] = lenc[j] - 1;
/* Inner loop.  Extends chain by one or backtracks */
	    i__3 = jord;
	    for (kk = 1; kk <= i__3; ++kk) {
		in1 = out[j];
		if (in1 < 0) {
		    goto L50;
		}
		in2 = ip[j] + lenc[j] - 1;
		in1 = in2 - in1;
/* Forward scan */
		i__4 = in2;
		for (ii = in1; ii <= i__4; ++ii) {
		    i__ = irn[ii];
		    if (cv[i__] == id1) {
			goto L40;
		    }
/* Column J has not yet been accessed during this pass */
		    j1 = j;
		    j = iperm[i__];
		    cv[i__] = id1;
		    pr[j] = j1;
		    out[j1] = in2 - ii - 1;
		    goto L70;
L40:
		    ;
		}
/* Backtracking step. */
L50:
		j1 = pr[j];
		if (j1 == -1) {
/* No augmenting path exists for column J. */
		    ++nfc;
		    fc[nfc] = j;
		    if (nfc > num2) {
/* A matching of maximum size NUM1 is not possible */
			last = jord;
			goto L101;
		    }
		    goto L100;
		}
		j = j1;
/* L60: */
	    }
/* End of dummy loop; this point is never reached */
L70:
	    ;
	}
/* End of dummy loop; this point is never reached */
/* New assignment is made. */
L80:
	iperm[i__] = j;
	arp[j] = ii - ip[j] + 1;
	++(*num);
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
	    j = pr[j];
	    if (j == -1) {
		goto L95;
	    }
	    ii = ip[j] + lenc[j] - out[j] - 2;
	    i__ = irn[ii];
	    iperm[i__] = j;
/* L90: */
	}
/* End of dummy loop; this point is never reached */
L95:
	if (*num == num1) {
/* A matching of maximum size NUM1 is found */
	    last = jord;
	    goto L101;
	}

L100:
	;
    }
/* All unassigned columns have been considered */
    last = *n;
/* Now, a transversal is computed or is not possible. */
/* Complete FC before returning. */
L101:
    i__1 = *n;
    for (jord = last + 1; jord <= i__1; ++jord) {
	++nfc;
	fc[nfc] = fc[jord - num0];
/* L110: */
    }
/*  199 RETURN */
    return 0;
}